

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_rust.cpp
# Opt level: O0

set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* flatbuffers::(anonymous_namespace)::RustKeywords_abi_cxx11_(void)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_ef0;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a0a;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_a09;
  undefined1 local_a08;
  allocator<char> local_a07;
  allocator<char> local_a06;
  allocator<char> local_a05;
  allocator<char> local_a04;
  allocator<char> local_a03;
  allocator<char> local_a02;
  allocator<char> local_a01;
  allocator<char> local_a00;
  allocator<char> local_9ff;
  allocator<char> local_9fe;
  allocator<char> local_9fd;
  allocator<char> local_9fc;
  allocator<char> local_9fb;
  allocator<char> local_9fa;
  allocator<char> local_9f9;
  allocator<char> local_9f8;
  allocator<char> local_9f7;
  allocator<char> local_9f6;
  allocator<char> local_9f5;
  allocator<char> local_9f4;
  allocator<char> local_9f3;
  allocator<char> local_9f2;
  allocator<char> local_9f1;
  allocator<char> local_9f0;
  allocator<char> local_9ef;
  allocator<char> local_9ee;
  allocator<char> local_9ed;
  allocator<char> local_9ec;
  allocator<char> local_9eb;
  allocator<char> local_9ea;
  allocator<char> local_9e9;
  allocator<char> local_9e8;
  allocator<char> local_9e7;
  allocator<char> local_9e6;
  allocator<char> local_9e5;
  allocator<char> local_9e4;
  allocator<char> local_9e3;
  allocator<char> local_9e2;
  allocator<char> local_9e1;
  allocator<char> local_9e0;
  allocator<char> local_9df;
  allocator<char> local_9de;
  allocator<char> local_9dd;
  allocator<char> local_9dc;
  allocator<char> local_9db;
  allocator<char> local_9da;
  allocator<char> local_9d9;
  allocator<char> local_9d8;
  allocator<char> local_9d7;
  allocator<char> local_9d6;
  allocator<char> local_9d5;
  allocator<char> local_9d4;
  allocator<char> local_9d3;
  allocator<char> local_9d2;
  allocator<char> local_9d1;
  allocator<char> local_9d0;
  allocator<char> local_9cf;
  allocator<char> local_9ce;
  allocator<char> local_9cd;
  allocator<char> local_9cc;
  allocator<char> local_9cb;
  allocator<char> local_9ca;
  allocator<char> local_9c9;
  allocator<char> local_9c8;
  allocator<char> local_9c7;
  allocator<char> local_9c6;
  allocator<char> local_9c5;
  allocator<char> local_9c4;
  allocator<char> local_9c3;
  allocator<char> local_9c2;
  allocator<char> local_9c1;
  allocator<char> local_9c0;
  allocator<char> local_9bf;
  allocator<char> local_9be;
  allocator<char> local_9bd [20];
  allocator<char> local_9a9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_9a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_9a0;
  string local_980 [32];
  string local_960 [32];
  string local_940 [32];
  string local_920 [32];
  string local_900 [32];
  string local_8e0 [32];
  string local_8c0 [32];
  string local_8a0 [32];
  string local_880 [32];
  string local_860 [32];
  string local_840 [32];
  string local_820 [32];
  string local_800 [32];
  string local_7e0 [32];
  string local_7c0 [32];
  string local_7a0 [32];
  string local_780 [32];
  string local_760 [32];
  string local_740 [32];
  string local_720 [32];
  string local_700 [32];
  string local_6e0 [32];
  string local_6c0 [32];
  string local_6a0 [32];
  string local_680 [32];
  string local_660 [32];
  string local_640 [32];
  string local_620 [32];
  string local_600 [32];
  string local_5e0 [32];
  string local_5c0 [32];
  string local_5a0 [32];
  string local_580 [32];
  string local_560 [32];
  string local_540 [32];
  string local_520 [32];
  string local_500 [32];
  string local_4e0 [32];
  string local_4c0 [32];
  string local_4a0 [32];
  string local_480 [32];
  string local_460 [32];
  string local_440 [32];
  string local_420 [32];
  string local_400 [32];
  string local_3e0 [32];
  string local_3c0 [32];
  string local_3a0 [32];
  string local_380 [32];
  string local_360 [32];
  string local_340 [32];
  string local_320 [32];
  string local_300 [32];
  string local_2e0 [32];
  string local_2c0 [32];
  string local_2a0 [32];
  string local_280 [32];
  string local_260 [32];
  string local_240 [32];
  string local_220 [32];
  string local_200 [32];
  string local_1e0 [32];
  string local_1c0 [32];
  string local_1a0 [32];
  string local_180 [32];
  string local_160 [32];
  string local_140 [32];
  string local_120 [32];
  string local_100 [32];
  string local_e0 [32];
  string local_c0 [32];
  string local_a0 [32];
  string local_80 [32];
  string local_60 [32];
  string local_40 [32];
  iterator local_20;
  size_type_conflict local_18;
  
  local_a08 = 1;
  local_9a8 = &local_9a0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_9a0,"as",&local_9a9);
  local_9a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_980;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_980,"break",local_9bd);
  local_9a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_960;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_960,"const",&local_9be);
  local_9a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_940;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_940,"continue",&local_9bf);
  local_9a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_920;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_920,"crate",&local_9c0);
  local_9a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_900;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_900,"else",&local_9c1);
  local_9a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_8e0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_8e0,"enum",&local_9c2);
  local_9a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_8c0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_8c0,"extern",&local_9c3);
  local_9a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_8a0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_8a0,"false",&local_9c4);
  local_9a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_880;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_880,"fn",&local_9c5);
  local_9a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_860;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_860,"for",&local_9c6);
  local_9a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_840;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_840,"if",&local_9c7);
  local_9a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_820;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_820,"impl",&local_9c8);
  local_9a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_800;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_800,"in",&local_9c9);
  local_9a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_7e0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_7e0,"let",&local_9ca);
  local_9a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_7c0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_7c0,"loop",&local_9cb);
  local_9a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_7a0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_7a0,"match",&local_9cc);
  local_9a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_780;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_780,"mod",&local_9cd);
  local_9a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_760;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_760,"move",&local_9ce);
  local_9a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_740;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_740,"mut",&local_9cf);
  local_9a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_720;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_720,"pub",&local_9d0);
  local_9a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_700;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_700,"ref",&local_9d1);
  local_9a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_6e0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_6e0,"return",&local_9d2);
  local_9a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_6c0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_6c0,"Self",&local_9d3);
  local_9a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_6a0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_6a0,"self",&local_9d4);
  local_9a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_680;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_680,"static",&local_9d5);
  local_9a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_660;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_660,"struct",&local_9d6);
  local_9a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_640;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_640,"super",&local_9d7);
  local_9a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_620;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_620,"trait",&local_9d8);
  local_9a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_600;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_600,"true",&local_9d9);
  local_9a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5e0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_5e0,"type",&local_9da);
  local_9a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5c0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_5c0,"unsafe",&local_9db);
  local_9a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_5a0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_5a0,"use",&local_9dc);
  local_9a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_580;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_580,"where",&local_9dd);
  local_9a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_560;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_560,"while",&local_9de);
  local_9a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_540;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_540,"abstract",&local_9df);
  local_9a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_520;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_520,"alignof",&local_9e0);
  local_9a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_500;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_500,"become",&local_9e1);
  local_9a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4e0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_4e0,"box",&local_9e2);
  local_9a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4c0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_4c0,"do",&local_9e3);
  local_9a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4a0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_4a0,"final",&local_9e4);
  local_9a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_480;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_480,"macro",&local_9e5);
  local_9a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_460;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_460,"offsetof",&local_9e6);
  local_9a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_440;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_440,"override",&local_9e7);
  local_9a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_420;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_420,"priv",&local_9e8);
  local_9a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_400;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_400,"proc",&local_9e9);
  local_9a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3e0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_3e0,"pure",&local_9ea);
  local_9a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3c0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_3c0,"sizeof",&local_9eb);
  local_9a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3a0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_3a0,"typeof",&local_9ec);
  local_9a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_380;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_380,"unsized",&local_9ed);
  local_9a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_360;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_360,"virtual",&local_9ee);
  local_9a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_340;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_340,"yield",&local_9ef);
  local_9a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_320;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_320,"std",&local_9f0);
  local_9a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_300;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_300,"usize",&local_9f1);
  local_9a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2e0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_2e0,"isize",&local_9f2);
  local_9a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2c0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_2c0,"u8",&local_9f3);
  local_9a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2a0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_2a0,"i8",&local_9f4);
  local_9a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_280;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_280,"u16",&local_9f5);
  local_9a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_260;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_260,"i16",&local_9f6);
  local_9a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_240;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_240,"u32",&local_9f7);
  local_9a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_220;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_220,"i32",&local_9f8);
  local_9a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_200;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_200,"u64",&local_9f9);
  local_9a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1e0,"i64",&local_9fa);
  local_9a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1c0,"u128",&local_9fb);
  local_9a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_1a0,"i128",&local_9fc);
  local_9a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_180;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_180,"f32",&local_9fd);
  local_9a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_160;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_160,"f64",&local_9fe);
  local_9a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_140;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_140,"follow",&local_9ff);
  local_9a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_120;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_120,"push",&local_a00);
  local_9a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_100;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_100,"size",&local_a01);
  local_9a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_e0,"alignment",&local_a02);
  local_9a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_c0,"to_little_endian",&local_a03);
  local_9a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_a0,"from_little_endian",&local_a04);
  local_9a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_80,"ENUM_MAX",&local_a05);
  local_9a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_60,"ENUM_MIN",&local_a06);
  local_9a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_40,"ENUM_VALUES",&local_a07);
  local_a08 = 0;
  local_20 = &local_9a0;
  local_18 = 0x4c;
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  allocator(&local_a0a);
  __l._M_len = local_18;
  __l._M_array = local_20;
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(in_RDI,__l,&local_a09,&local_a0a);
  std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~allocator(&local_a0a);
  local_ef0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_20;
  do {
    local_ef0 = local_ef0 + -1;
    std::__cxx11::string::~string((string *)local_ef0);
  } while (local_ef0 != &local_9a0);
  std::allocator<char>::~allocator(&local_a07);
  std::allocator<char>::~allocator(&local_a06);
  std::allocator<char>::~allocator(&local_a05);
  std::allocator<char>::~allocator(&local_a04);
  std::allocator<char>::~allocator(&local_a03);
  std::allocator<char>::~allocator(&local_a02);
  std::allocator<char>::~allocator(&local_a01);
  std::allocator<char>::~allocator(&local_a00);
  std::allocator<char>::~allocator(&local_9ff);
  std::allocator<char>::~allocator(&local_9fe);
  std::allocator<char>::~allocator(&local_9fd);
  std::allocator<char>::~allocator(&local_9fc);
  std::allocator<char>::~allocator(&local_9fb);
  std::allocator<char>::~allocator(&local_9fa);
  std::allocator<char>::~allocator(&local_9f9);
  std::allocator<char>::~allocator(&local_9f8);
  std::allocator<char>::~allocator(&local_9f7);
  std::allocator<char>::~allocator(&local_9f6);
  std::allocator<char>::~allocator(&local_9f5);
  std::allocator<char>::~allocator(&local_9f4);
  std::allocator<char>::~allocator(&local_9f3);
  std::allocator<char>::~allocator(&local_9f2);
  std::allocator<char>::~allocator(&local_9f1);
  std::allocator<char>::~allocator(&local_9f0);
  std::allocator<char>::~allocator(&local_9ef);
  std::allocator<char>::~allocator(&local_9ee);
  std::allocator<char>::~allocator(&local_9ed);
  std::allocator<char>::~allocator(&local_9ec);
  std::allocator<char>::~allocator(&local_9eb);
  std::allocator<char>::~allocator(&local_9ea);
  std::allocator<char>::~allocator(&local_9e9);
  std::allocator<char>::~allocator(&local_9e8);
  std::allocator<char>::~allocator(&local_9e7);
  std::allocator<char>::~allocator(&local_9e6);
  std::allocator<char>::~allocator(&local_9e5);
  std::allocator<char>::~allocator(&local_9e4);
  std::allocator<char>::~allocator(&local_9e3);
  std::allocator<char>::~allocator(&local_9e2);
  std::allocator<char>::~allocator(&local_9e1);
  std::allocator<char>::~allocator(&local_9e0);
  std::allocator<char>::~allocator(&local_9df);
  std::allocator<char>::~allocator(&local_9de);
  std::allocator<char>::~allocator(&local_9dd);
  std::allocator<char>::~allocator(&local_9dc);
  std::allocator<char>::~allocator(&local_9db);
  std::allocator<char>::~allocator(&local_9da);
  std::allocator<char>::~allocator(&local_9d9);
  std::allocator<char>::~allocator(&local_9d8);
  std::allocator<char>::~allocator(&local_9d7);
  std::allocator<char>::~allocator(&local_9d6);
  std::allocator<char>::~allocator(&local_9d5);
  std::allocator<char>::~allocator(&local_9d4);
  std::allocator<char>::~allocator(&local_9d3);
  std::allocator<char>::~allocator(&local_9d2);
  std::allocator<char>::~allocator(&local_9d1);
  std::allocator<char>::~allocator(&local_9d0);
  std::allocator<char>::~allocator(&local_9cf);
  std::allocator<char>::~allocator(&local_9ce);
  std::allocator<char>::~allocator(&local_9cd);
  std::allocator<char>::~allocator(&local_9cc);
  std::allocator<char>::~allocator(&local_9cb);
  std::allocator<char>::~allocator(&local_9ca);
  std::allocator<char>::~allocator(&local_9c9);
  std::allocator<char>::~allocator(&local_9c8);
  std::allocator<char>::~allocator(&local_9c7);
  std::allocator<char>::~allocator(&local_9c6);
  std::allocator<char>::~allocator(&local_9c5);
  std::allocator<char>::~allocator(&local_9c4);
  std::allocator<char>::~allocator(&local_9c3);
  std::allocator<char>::~allocator(&local_9c2);
  std::allocator<char>::~allocator(&local_9c1);
  std::allocator<char>::~allocator(&local_9c0);
  std::allocator<char>::~allocator(&local_9bf);
  std::allocator<char>::~allocator(&local_9be);
  std::allocator<char>::~allocator(local_9bd);
  std::allocator<char>::~allocator(&local_9a9);
  return in_RDI;
}

Assistant:

static std::set<std::string> RustKeywords() {
  return {
    // https://doc.rust-lang.org/book/second-edition/appendix-01-keywords.html
    "as",
    "break",
    "const",
    "continue",
    "crate",
    "else",
    "enum",
    "extern",
    "false",
    "fn",
    "for",
    "if",
    "impl",
    "in",
    "let",
    "loop",
    "match",
    "mod",
    "move",
    "mut",
    "pub",
    "ref",
    "return",
    "Self",
    "self",
    "static",
    "struct",
    "super",
    "trait",
    "true",
    "type",
    "unsafe",
    "use",
    "where",
    "while",
    // future possible keywords
    "abstract",
    "alignof",
    "become",
    "box",
    "do",
    "final",
    "macro",
    "offsetof",
    "override",
    "priv",
    "proc",
    "pure",
    "sizeof",
    "typeof",
    "unsized",
    "virtual",
    "yield",
    // other rust terms we should not use
    "std",
    "usize",
    "isize",
    "u8",
    "i8",
    "u16",
    "i16",
    "u32",
    "i32",
    "u64",
    "i64",
    "u128",
    "i128",
    "f32",
    "f64",
    // Terms that we use ourselves
    "follow",
    "push",
    "size",
    "alignment",
    "to_little_endian",
    "from_little_endian",
    "ENUM_MAX",
    "ENUM_MIN",
    "ENUM_VALUES",
  };
}